

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ComputeWorkGroupSizeCase::iterate
          (ComputeWorkGroupSizeCase *this)

{
  pointer pcVar1;
  pointer pcVar2;
  TestLog *pTVar3;
  Context *pCVar4;
  RenderContext *pRVar5;
  int iVar6;
  undefined4 extraout_var;
  TestError *pTVar7;
  string *psVar8;
  long lVar9;
  ScopedLogSection section;
  CallLogWrapper gl;
  ShaderProgram program;
  ResultCollector result;
  ScopedLogSection local_288;
  string local_280;
  uint local_260;
  value_type local_258;
  CallLogWrapper local_238;
  undefined1 local_220 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_190;
  undefined1 local_170 [32];
  undefined1 local_150 [152];
  GLuint local_b8;
  bool local_90;
  ResultCollector local_80;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_238,(Functions *)CONCAT44(extraout_var,iVar6),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pcVar2 = local_150 + 0x10;
  local_150._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_80,pTVar3,(string *)local_150);
  if ((pointer)local_150._0_8_ != pcVar2) {
    operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
  }
  local_238.m_enableLog = true;
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_150._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"OneDimensional","");
  pcVar1 = local_220 + 0x10;
  local_220._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"1D","");
  psVar8 = (string *)local_220;
  tcu::ScopedLogSection::ScopedLogSection(&local_288,pTVar3,(string *)local_150,psVar8);
  if ((pointer)local_220._0_8_ != pcVar1) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  if ((pointer)local_150._0_8_ != pcVar2) {
    operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
  }
  pCVar4 = (this->super_TestCase).m_context;
  pRVar5 = pCVar4->m_renderCtx;
  memset(local_220,0,0xac);
  local_170._0_8_ = (pointer)0x0;
  local_170[8] = 0;
  local_170._9_7_ = 0;
  local_170[0x10] = 0;
  local_170._17_8_ = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_280,(_anonymous_namespace_ *)pCVar4,
             (Context *)
             "${GLSL_VERSION_DECL}\nlayout (local_size_x = 3) in;\nlayout(binding = 0) buffer Output\n{\n\thighp float val;\n} sb_out;\n\nvoid main (void)\n{\n\tsb_out.val = 1.0;\n}\n"
             ,(char *)psVar8);
  local_260 = 5;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_280._M_dataplus._M_p,
             local_280._M_dataplus._M_p + local_280._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_220 + (ulong)local_260 * 0x18),&local_258);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_150,pRVar5,(ProgramSources *)local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_170);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_190);
  lVar9 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_220 + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (ShaderProgram *)local_150);
  if (local_90 == false) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"failed to build program","program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
               ,0x1fa);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_220._0_8_ = (pointer)0x100000003;
  local_220._8_4_ = 1;
  gls::StateQueryUtil::verifyStateProgramIntegerVec3
            (&local_80,&local_238,local_b8,0x8267,(IVec3 *)local_220,this->m_verifier);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_150);
  tcu::TestLog::endSection(local_288.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_150._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"TwoDimensional","");
  local_220._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"2D","");
  psVar8 = (string *)local_220;
  tcu::ScopedLogSection::ScopedLogSection(&local_288,pTVar3,(string *)local_150,psVar8);
  if ((pointer)local_220._0_8_ != pcVar1) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  if ((pointer)local_150._0_8_ != pcVar2) {
    operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
  }
  pCVar4 = (this->super_TestCase).m_context;
  pRVar5 = pCVar4->m_renderCtx;
  memset(local_220,0,0xac);
  local_170._0_8_ = (pointer)0x0;
  local_170[8] = 0;
  local_170._9_7_ = 0;
  local_170[0x10] = 0;
  local_170._17_8_ = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_280,(_anonymous_namespace_ *)pCVar4,
             (Context *)
             "${GLSL_VERSION_DECL}\nlayout (local_size_x = 3, local_size_y = 2) in;\nlayout(binding = 0) buffer Output\n{\n\thighp float val;\n} sb_out;\n\nvoid main (void)\n{\n\tsb_out.val = 1.0;\n}\n"
             ,(char *)psVar8);
  local_260 = 5;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_280._M_dataplus._M_p,
             local_280._M_dataplus._M_p + local_280._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_220 + (ulong)local_260 * 0x18),&local_258);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_150,pRVar5,(ProgramSources *)local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_170);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_190);
  lVar9 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_220 + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (ShaderProgram *)local_150);
  if (local_90 != false) {
    local_220._0_8_ = (pointer)0x200000003;
    local_220._8_4_ = 1;
    gls::StateQueryUtil::verifyStateProgramIntegerVec3
              (&local_80,&local_238,local_b8,0x8267,(IVec3 *)local_220,this->m_verifier);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_150);
    tcu::TestLog::endSection(local_288.m_log);
    pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_150._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"TreeDimensional","");
    local_220._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"3D","");
    psVar8 = (string *)local_220;
    tcu::ScopedLogSection::ScopedLogSection(&local_288,pTVar3,(string *)local_150,psVar8);
    if ((pointer)local_220._0_8_ != pcVar1) {
      operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
    }
    if ((pointer)local_150._0_8_ != pcVar2) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
    }
    pCVar4 = (this->super_TestCase).m_context;
    pRVar5 = pCVar4->m_renderCtx;
    memset(local_220,0,0xac);
    local_170._0_8_ = (pointer)0x0;
    local_170[8] = 0;
    local_170._9_7_ = 0;
    local_170[0x10] = 0;
    local_170._17_8_ = 0;
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_280,(_anonymous_namespace_ *)pCVar4,
               (Context *)
               "${GLSL_VERSION_DECL}\nlayout (local_size_x = 3, local_size_y = 2, local_size_z = 4) in;\nlayout(binding = 0) buffer Output\n{\n\thighp float val;\n} sb_out;\n\nvoid main (void)\n{\n\tsb_out.val = 1.0;\n}\n"
               ,(char *)psVar8);
    local_260 = 5;
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,local_280._M_dataplus._M_p,
               local_280._M_dataplus._M_p + local_280._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_220 + (ulong)local_260 * 0x18),&local_258);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_150,pRVar5,(ProgramSources *)local_220)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_170);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_190);
    lVar9 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_220 + lVar9));
      lVar9 = lVar9 + -0x18;
    } while (lVar9 != -0x18);
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                    (ShaderProgram *)local_150);
    if (local_90 != false) {
      local_220._0_8_ = (pointer)0x200000003;
      local_220._8_4_ = 4;
      gls::StateQueryUtil::verifyStateProgramIntegerVec3
                (&local_80,&local_238,local_b8,0x8267,(IVec3 *)local_220,this->m_verifier);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_150);
      tcu::TestLog::endSection(local_288.m_log);
      tcu::ResultCollector::setTestContextResult
                (&local_80,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
        operator_delete(local_80.m_message._M_dataplus._M_p,
                        local_80.m_message.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
        operator_delete(local_80.m_prefix._M_dataplus._M_p,
                        local_80.m_prefix.field_2._M_allocated_capacity + 1);
      }
      glu::CallLogWrapper::~CallLogWrapper(&local_238);
      return STOP;
    }
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"failed to build program","program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
               ,0x210);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,"failed to build program","program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
             ,0x205);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

ComputeWorkGroupSizeCase::IterateResult ComputeWorkGroupSizeCase::iterate (void)
{
	static const char* const	s_computeTemplate1D =	"${GLSL_VERSION_DECL}\n"
														"layout (local_size_x = 3) in;\n"
														"layout(binding = 0) buffer Output\n"
														"{\n"
														"	highp float val;\n"
														"} sb_out;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														"	sb_out.val = 1.0;\n"
														"}\n";
	static const char* const	s_computeTemplate2D =	"${GLSL_VERSION_DECL}\n"
														"layout (local_size_x = 3, local_size_y = 2) in;\n"
														"layout(binding = 0) buffer Output\n"
														"{\n"
														"	highp float val;\n"
														"} sb_out;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														"	sb_out.val = 1.0;\n"
														"}\n";
	static const char* const	s_computeTemplate3D =	"${GLSL_VERSION_DECL}\n"
														"layout (local_size_x = 3, local_size_y = 2, local_size_z = 4) in;\n"
														"layout(binding = 0) buffer Output\n"
														"{\n"
														"	highp float val;\n"
														"} sb_out;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														"	sb_out.val = 1.0;\n"
														"}\n";

	glu::CallLogWrapper			gl						(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector		result					(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "OneDimensional", "1D");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, s_computeTemplate1D)));

		m_testCtx.getLog() << program;

		TCU_CHECK_MSG(program.isOk(), "failed to build program");

		verifyStateProgramIntegerVec3(result, gl, program.getProgram(), GL_COMPUTE_WORK_GROUP_SIZE, tcu::IVec3(3, 1, 1), m_verifier);
	}

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "TwoDimensional", "2D");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, s_computeTemplate2D)));

		m_testCtx.getLog() << program;

		TCU_CHECK_MSG(program.isOk(), "failed to build program");

		verifyStateProgramIntegerVec3(result, gl, program.getProgram(), GL_COMPUTE_WORK_GROUP_SIZE, tcu::IVec3(3, 2, 1), m_verifier);
	}

	{
		const tcu::ScopedLogSection section		(m_testCtx.getLog(), "TreeDimensional", "3D");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(specializeShader(m_context, s_computeTemplate3D)));

		m_testCtx.getLog() << program;

		TCU_CHECK_MSG(program.isOk(), "failed to build program");

		verifyStateProgramIntegerVec3(result, gl, program.getProgram(), GL_COMPUTE_WORK_GROUP_SIZE, tcu::IVec3(3, 2, 4), m_verifier);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}